

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall Log_Cerr_Buffer::sync(Log_Cerr_Buffer *this)

{
  size_t sVar1;
  Log_Class *pLVar2;
  char *pcVar3;
  ulong uVar4;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  long local_70;
  size_t end;
  size_t start;
  string buffer;
  string local_30 [32];
  Log_Cerr_Buffer *local_10;
  Log_Cerr_Buffer *this_local;
  
  local_10 = this;
  pLVar2 = Nova::Log::Instance();
  if ((pLVar2->suppress_cerr & 1U) == 0) {
    if ((Nova::Log::Log_Entry::start_on_separate_line & 1U) != 0) {
      putchar(10);
    }
    Nova::Log::Log_Entry::start_on_separate_line = false;
    std::__cxx11::stringbuf::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    fputs(pcVar3,_stderr);
    std::__cxx11::string::~string(local_30);
  }
  pLVar2 = Nova::Log::Instance();
  if (pLVar2->log_file != (FILE *)0x0) {
    if ((Nova::Log::Log_Entry::log_file_start_on_separate_line & 1U) != 0) {
      pLVar2 = Nova::Log::Instance();
      putc(10,(FILE *)pLVar2->log_file);
    }
    Nova::Log::Log_Entry::log_file_start_on_separate_line = false;
    std::__cxx11::stringbuf::str();
    end = 0;
    while (sVar1 = end, uVar4 = std::__cxx11::string::length(), sVar1 < uVar4) {
      local_70 = std::__cxx11::string::find((char)&start,10);
      pLVar2 = Nova::Log::Instance();
      if ((pLVar2->xml & 1U) != 0) {
        pLVar2 = Nova::Log::Instance();
        fputs("<error><!--",(FILE *)pLVar2->log_file);
      }
      std::__cxx11::string::substr((ulong)local_90,(ulong)&start);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pLVar2 = Nova::Log::Instance();
      fputs(pcVar3,(FILE *)pLVar2->log_file);
      std::__cxx11::string::~string(local_90);
      pLVar2 = Nova::Log::Instance();
      if ((pLVar2->xml & 1U) != 0) {
        pLVar2 = Nova::Log::Instance();
        fputs("--></error>",(FILE *)pLVar2->log_file);
      }
      pLVar2 = Nova::Log::Instance();
      putc(10,(FILE *)pLVar2->log_file);
      if (local_70 == -1) break;
      end = local_70 + 1;
    }
    std::__cxx11::string::~string((string *)&start);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",&local_b1);
  std::__cxx11::stringbuf::str((string *)this);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::streambuf::sync();
  return;
}

Assistant:

int sync()
    {
        if(!Instance()->suppress_cerr){
            if(Log_Entry::start_on_separate_line) putchar('\n');Log_Entry::start_on_separate_line=false;
            fputs(str().c_str(),stderr);}
        if(Instance()->log_file){
            if(Log_Entry::log_file_start_on_separate_line) putc('\n',Instance()->log_file);Log_Entry::log_file_start_on_separate_line=false;
            std::string buffer=str();
            for(size_t start=0;start<buffer.length();){
                size_t end=buffer.find('\n',start);
                if(Instance()->xml) fputs("<error><!--",Instance()->log_file);
                fputs(buffer.substr(start,end-start).c_str(),Instance()->log_file);
                if(Instance()->xml) fputs("--></error>",Instance()->log_file);
                putc('\n',Instance()->log_file);
                if(end!=std::string::npos) start=end+1;
                else break;}}
        str("");return std::stringbuf::sync();
    }